

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxRouter.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 local_ce0 [8];
  CDesign CurrentDesign;
  char **argv_local;
  int argc_local;
  
  CurrentDesign._3264_8_ = argv;
  printf("*****************************************\n");
  printf("*             BoxRouter 2.0             *\n");
  printf("*           (ICCAD07 version)           *\n");
  printf("*                                       *\n");
  printf("*     Minsik Cho     Dr. David Pan      *\n");
  printf("*      Kun Yuan        Katrina Lu       *\n");
  printf("*    UT Design Automation Laboratory    *\n");
  printf("*   The University of Texas at Austin   *\n");
  printf("*       www.cerc.utexas.edu/utda        *\n");
  printf("*****************************************\n");
  if (argc < 2) {
    CObject::Display(1,"parameter file is missing\n");
  }
  CDesign::CDesign((CDesign *)local_ce0);
  StopWatch(1);
  iVar1 = CDesign::Initialize((CDesign *)local_ce0,*(char **)(CurrentDesign._3264_8_ + 8));
  if (iVar1 != 0) {
    CGRouter::Routing((CDesign *)local_ce0);
    CDesign::Report((CDesign *)local_ce0,*(char **)(CurrentDesign._3264_8_ + 8));
    CDesign::PrintResult((CDesign *)local_ce0);
  }
  CDesign::~CDesign((CDesign *)local_ce0);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	printf("*****************************************\n");
	printf("*             BoxRouter 2.0             *\n");
//	printf("*            (ISPD07 version)           *\n");
	printf("*           (ICCAD07 version)           *\n");
	printf("*                                       *\n");
	printf("*     Minsik Cho     Dr. David Pan      *\n");
	printf("*      Kun Yuan        Katrina Lu       *\n");
	printf("*    UT Design Automation Laboratory    *\n");
	printf("*   The University of Texas at Austin   *\n");
	printf("*       www.cerc.utexas.edu/utda        *\n");  
	printf("*****************************************\n");

	if(argc<2)	CDesign::Display(DISPLAY_MODE_ERRO,"parameter file is missing\n");

	CDesign	CurrentDesign;	
	StopWatch(STOPWATCH_OPTION_RESET);

	if(CurrentDesign.Initialize(argv[1]))
	{
		CGRouter::Routing(&CurrentDesign);
		CurrentDesign.Report(argv[1]);
		CurrentDesign.PrintResult();
	}

	return 0;
}